

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

double crnlib::bessel0(double x)

{
  undefined4 local_3c;
  double dStack_38;
  int k;
  double ds;
  double pow;
  double sum;
  double xh;
  double EPSILON_RATIO;
  double x_local;
  
  ds = 1.0;
  local_3c = 0;
  dStack_38 = 1.0;
  for (pow = 1.0; pow * 1e-16 < dStack_38; pow = pow + dStack_38) {
    local_3c = local_3c + 1;
    ds = ds * ((x * 0.5) / (double)local_3c);
    dStack_38 = ds * ds;
  }
  return pow;
}

Assistant:

static double bessel0(double x)
    {
        const double EPSILON_RATIO = 1E-16;
        double xh, sum, pow, ds;
        int k;

        xh = 0.5 * x;
        sum = 1.0;
        pow = 1.0;
        k = 0;
        ds = 1.0;
        while (ds > sum * EPSILON_RATIO) // FIXME: Shouldn't this stop after X iterations for max. safety?
        {
            ++k;
            pow = pow * (xh / k);
            ds = pow * pow;
            sum = sum + ds;
        }

        return sum;
    }